

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O3

void __thiscall higan::LogFile::Append(LogFile *this,char *str,size_t len)

{
  _Head_base<0UL,_higan::Mutex_*,_false> mutex;
  MutexLockGuard local_28;
  MutexLockGuard guard;
  
  mutex._M_head_impl =
       (this->mutex_)._M_t.super___uniq_ptr_impl<higan::Mutex,_std::default_delete<higan::Mutex>_>.
       _M_t.super__Tuple_impl<0UL,_higan::Mutex_*,_std::default_delete<higan::Mutex>_>.
       super__Head_base<0UL,_higan::Mutex_*,_false>._M_head_impl;
  if (mutex._M_head_impl != (Mutex *)0x0) {
    MutexLockGuard::MutexLockGuard(&local_28,mutex._M_head_impl);
    AppendInternal(this,str,len);
    MutexLockGuard::~MutexLockGuard(&local_28);
    return;
  }
  AppendInternal(this,str,len);
  return;
}

Assistant:

void LogFile::Append(const char* str, size_t len)
{
	if (mutex_)
	{
		MutexLockGuard guard(*mutex_);
		AppendInternal(str, len);
	}
	else
	{
		AppendInternal(str, len);
	}
}